

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.hpp
# Opt level: O2

parse_return
msgpack::v2::detail::parse_imp<msgpack::v2::detail::create_object_visitor>
          (char *data,size_t len,size_t *off,create_object_visitor *v)

{
  parse_return pVar1;
  size_t noff;
  parse_helper<msgpack::v2::detail::create_object_visitor> h;
  
  noff = *off;
  if (noff < len) {
    context<msgpack::v2::detail::parse_helper<msgpack::v2::detail::create_object_visitor>_>::context
              (&h.
                super_context<msgpack::v2::detail::parse_helper<msgpack::v2::detail::create_object_visitor>_>
              );
    h.m_visitor = v;
    pVar1 = context<msgpack::v2::detail::parse_helper<msgpack::v2::detail::create_object_visitor>_>
            ::execute(&h.
                       super_context<msgpack::v2::detail::parse_helper<msgpack::v2::detail::create_object_visitor>_>
                      ,data,len,&noff);
    if (pVar1 == PARSE_CONTINUE) {
      *off = noff;
      pVar1 = PARSE_CONTINUE;
      create_object_visitor::insufficient_bytes(v,noff - 1,noff);
    }
    else if (pVar1 == PARSE_SUCCESS) {
      *off = noff;
      pVar1 = PARSE_SUCCESS - (uint)(noff < len);
    }
    std::
    _Vector_base<msgpack::v2::detail::context<msgpack::v2::detail::parse_helper<msgpack::v2::detail::create_object_visitor>_>::unpack_stack::stack_elem,_std::allocator<msgpack::v2::detail::context<msgpack::v2::detail::parse_helper<msgpack::v2::detail::create_object_visitor>_>::unpack_stack::stack_elem>_>
    ::~_Vector_base((_Vector_base<msgpack::v2::detail::context<msgpack::v2::detail::parse_helper<msgpack::v2::detail::create_object_visitor>_>::unpack_stack::stack_elem,_std::allocator<msgpack::v2::detail::context<msgpack::v2::detail::parse_helper<msgpack::v2::detail::create_object_visitor>_>::unpack_stack::stack_elem>_>
                     *)&h.
                        super_context<msgpack::v2::detail::parse_helper<msgpack::v2::detail::create_object_visitor>_>
                        .m_stack);
  }
  else {
    create_object_visitor::insufficient_bytes(v,noff,noff);
    pVar1 = PARSE_CONTINUE;
  }
  return pVar1;
}

Assistant:

inline parse_return
parse_imp(const char* data, size_t len, size_t& off, Visitor& v) {
    std::size_t noff = off;

    if(len <= noff) {
        // FIXME
        v.insufficient_bytes(noff, noff);
        return PARSE_CONTINUE;
    }
    detail::parse_helper<Visitor> h(v);
    parse_return ret = h.execute(data, len, noff);
    switch (ret) {
    case PARSE_CONTINUE:
        off = noff;
        v.insufficient_bytes(noff - 1, noff);
        return ret;
    case PARSE_SUCCESS:
        off = noff;
        if(noff < len) {
            return PARSE_EXTRA_BYTES;
        }
        return ret;
    default:
        return ret;
    }
}